

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

bool __thiscall MinVR::element::set_comment(element *this,char *the_comment)

{
  allocator<char> local_39;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  set_name(this,"Comment");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,the_comment,&local_39);
  if (local_30 != 0) {
    std::__cxx11::string::_M_assign((string *)&this->m_value);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  this->is_comment = true;
  return true;
}

Assistant:

bool element::set_comment(char* the_comment)
{
    set_name("Comment");
    set_value(the_comment);
    is_comment = true;
    return true;
}